

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.h
# Opt level: O2

void __thiscall
CVmObjTable::gc_set_init_conditions(CVmObjTable *this,vm_obj_id_t id,CVmObjPageEntry *entry)

{
  ushort uVar1;
  
  uVar1 = *(ushort *)&entry->field_0x14;
  *(ushort *)&entry->field_0x14 = uVar1 & 0xfff3;
  if ((uVar1 & 2) == 0) {
    return;
  }
  add_to_gc_queue(this,id,entry,2);
  return;
}

Assistant:

void gc_set_init_conditions(vm_obj_id_t id,
                                struct CVmObjPageEntry *entry)
    {
        /* 
         *   Mark the object as unreachable -- at the start of each GC pass,
         *   all non-root-set objects must be marked unreachable.  (It
         *   doesn't matter how we mark root set objects, so we simply mark
         *   everything as reachable to avoid an unnecessary test.)  
         */
        entry->reachable_ = VMOBJ_UNREACHABLE;

        /* 
         *   If it's in the root set, add it to the GC work queue -- all
         *   root-set objects must be in the work queue and marked as
         *   reachable at the start of each GC pass.
         */
        if (entry->in_root_set_)
            add_to_gc_queue(id, entry, VMOBJ_REACHABLE);
    }